

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor)

{
  ImFontAtlas *this;
  ImTextureID texture_id;
  bool bVar1;
  float fVar2;
  float in_XMM1_Db;
  ImVec2 uv [4];
  ImVec2 local_d8;
  ImVec2 local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  undefined8 uStack_b0;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (mouse_cursor != -1) {
    this = draw_list->_Data->Font->ContainerAtlas;
    local_90.x = 0.0;
    local_90.y = 0.0;
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_78.x = 0.0;
    local_78.y = 0.0;
    IStack_70.x = 0.0;
    IStack_70.y = 0.0;
    local_88.x = 0.0;
    local_88.y = 0.0;
    IStack_80.x = 0.0;
    IStack_80.y = 0.0;
    local_d0 = pos;
    local_68 = scale;
    fStack_64 = in_XMM1_Db;
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&local_90,&local_98,&local_88,&local_78);
    if (bVar1) {
      local_b8 = local_d0.x - local_90.x;
      fStack_b4 = local_d0.y - local_90.y;
      uStack_b0 = 0;
      local_d0.y = fStack_b4;
      local_d0.x = local_b8;
      texture_id = this->TexID;
      ImDrawList::PushTextureID(draw_list,texture_id);
      local_58 = local_68 + local_b8;
      fStack_54 = local_68 * 0.0 + fStack_b4;
      fStack_50 = fStack_64 + (float)uStack_b0;
      fStack_4c = uStack_b0._4_4_ + 0.0;
      local_d8.y = fStack_54;
      local_d8.x = local_58;
      local_c8 = local_68 * local_98.x;
      fStack_c4 = local_68 * local_98.y;
      fStack_c0 = local_68 * 0.0;
      fStack_bc = local_68 * 0.0;
      local_48 = local_58 + local_c8;
      fStack_44 = fStack_54 + fStack_c4;
      fStack_40 = fStack_50 + fStack_c0;
      fStack_3c = fStack_4c + fStack_bc;
      local_a0.y = fStack_44;
      local_a0.x = local_48;
      ImDrawList::AddImage(draw_list,texture_id,&local_d8,&local_a0,&local_78,&IStack_70,0x30000000)
      ;
      fVar2 = local_68 + local_68 + local_b8;
      local_d8.y = fStack_54;
      local_d8.x = fVar2;
      local_a0.y = fStack_44;
      local_a0.x = fVar2 + local_c8;
      ImDrawList::AddImage(draw_list,texture_id,&local_d8,&local_a0,&local_78,&IStack_70,0x30000000)
      ;
      local_c8 = local_c8 + local_b8;
      fStack_c4 = fStack_c4 + fStack_b4;
      fStack_c0 = fStack_c0 + (float)uStack_b0;
      fStack_bc = fStack_bc + uStack_b0._4_4_;
      local_d8.y = fStack_c4;
      local_d8.x = local_c8;
      ImDrawList::AddImage(draw_list,texture_id,&local_d0,&local_d8,&local_78,&IStack_70,0xff000000)
      ;
      local_d8.y = fStack_c4;
      local_d8.x = local_c8;
      ImDrawList::AddImage(draw_list,texture_id,&local_d0,&local_d8,&local_88,&IStack_80,0xffffffff)
      ;
      (draw_list->_TextureIdStack).Size = (draw_list->_TextureIdStack).Size + -1;
      ImDrawList::UpdateTextureID(draw_list);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    const ImU32 col_shadow = IM_COL32(0, 0, 0, 48);
    const ImU32 col_border = IM_COL32(0, 0, 0, 255);          // Black
    const ImU32 col_fill   = IM_COL32(255, 255, 255, 255);    // White

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1,0)*scale, pos + ImVec2(1,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2,0)*scale, pos + ImVec2(2,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}